

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

Iterator * __thiscall spvtools::EnumSet<spvtools::Extension>::Iterator::operator++(Iterator *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  byte local_21;
  Iterator *this_local;
  
  do {
    uVar1 = this->bucketIndex_;
    sVar3 = std::
            vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
            ::size(&this->set_->buckets_);
    if (sVar3 <= uVar1) {
      sVar3 = std::
              vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
              ::size(&this->set_->buckets_);
      this->bucketIndex_ = sVar3;
      this->bucketOffset_ = 0;
      return this;
    }
    if (this->bucketOffset_ == 0x3f) {
      this->bucketOffset_ = 0;
      this->bucketIndex_ = this->bucketIndex_ + 1;
    }
    else {
      this->bucketOffset_ = this->bucketOffset_ + 1;
    }
    uVar1 = this->bucketIndex_;
    sVar3 = std::
            vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
            ::size(&this->set_->buckets_);
    local_21 = 0;
    if (uVar1 < sVar3) {
      bVar2 = HasEnumAt(this->set_,this->bucketIndex_,(ulong)this->bucketOffset_);
      local_21 = bVar2 ^ 0xff;
    }
  } while ((local_21 & 1) != 0);
  return this;
}

Assistant:

Iterator& operator++() {
      do {
        if (bucketIndex_ >= set_->buckets_.size()) {
          bucketIndex_ = set_->buckets_.size();
          bucketOffset_ = 0;
          break;
        }

        if (bucketOffset_ + 1 == kBucketSize) {
          bucketOffset_ = 0;
          ++bucketIndex_;
        } else {
          ++bucketOffset_;
        }

      } while (bucketIndex_ < set_->buckets_.size() &&
               !set_->HasEnumAt(bucketIndex_, bucketOffset_));
      return *this;
    }